

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O2

int inv_weight(void)

{
  uint uVar1;
  xchar xVar2;
  int iVar3;
  obj **ppoVar4;
  int iVar5;
  
  ppoVar4 = &invent;
  iVar3 = 0;
  while (ppoVar4 = &((obj *)ppoVar4)->nobj->nobj, (obj *)ppoVar4 != (obj *)0x0) {
    if (((obj *)ppoVar4)->oclass == '\f') {
      iVar3 = iVar3 + (int)(((long)((obj *)ppoVar4)->quan + 0x32) / 100);
    }
    else if ((((obj *)ppoVar4)->otyp != 0x214) || (((youmonst.data)->mflags2 & 0x8000000) == 0)) {
      uVar1 = ((obj *)ppoVar4)->owt;
      if (((obj *)ppoVar4 == uarm) &&
         (iVar5 = uVar1 - objects[0x77].oc_weight, objects[0x77].oc_weight <= uVar1 && iVar5 != 0))
      {
        xVar2 = mon_skill_level(0x28,&youmonst);
        if ('\x01' < xVar2) {
          if (xVar2 == '\x03') {
            iVar5 = iVar5 / 2;
          }
          else {
            if (xVar2 == '\x02') {
              iVar5 = iVar5 * 3;
            }
            iVar5 = iVar5 / 4;
          }
        }
        iVar3 = iVar3 + (uint)objects[0x77].oc_weight + iVar5;
      }
      else {
        iVar3 = iVar3 + uVar1;
      }
    }
  }
  wc = weight_cap();
  return iVar3 - wc;
}

Assistant:

int inv_weight(void)
{
	struct obj *otmp = invent;
	int wt = 0;

	while (otmp) {
	    if (otmp->oclass == COIN_CLASS) {
		wt += (int)(((long)otmp->quan + 50L) / 100L);
	    } else if (otmp->otyp != BOULDER || !throws_rocks(youmonst.data)) {
		if (otmp == uarm && otmp->owt > P_BODY_ARMOR_MIN_WEIGHT) {
		    /*
		     * Reduce weight of worn body armor based on skill and
		     * weight difference from leather armor:
		     *
		     *  - unskilled -> no reduction
		     *  - basic     -> 25% reduction
		     *  - skilled   -> 50% reduction
		     *  - expert    -> 75% reduction
		     *
		     * e.g. Wearing plate mail {450} at expert only weighs {225}.
		     */
		    int wt_diff = otmp->owt - P_BODY_ARMOR_MIN_WEIGHT;
		    int ba_skill = mon_skill_level(P_BODY_ARMOR, &youmonst);
		    wt += P_BODY_ARMOR_MIN_WEIGHT;
		    if (ba_skill <= P_UNSKILLED)
			wt += wt_diff;
		    else if (ba_skill == P_BASIC)
			wt += wt_diff * 3 / 4;
		    else if (ba_skill == P_SKILLED)
			wt += wt_diff / 2;
		    else if (ba_skill >= P_EXPERT)
			wt += wt_diff / 4;
		} else {
		    wt += otmp->owt;
		}
	    }
	    otmp = otmp->nobj;
	}
	wc = weight_cap();
	return wt - wc;
}